

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O3

CBString * fitEntryTypeToUString(CBString *__return_storage_ptr__,UINT8 type)

{
  char *s;
  
  switch(type & 0x7f) {
  case 0:
    s = "FIT Header";
    break;
  case 1:
    s = "Microcode";
    break;
  case 2:
    s = "Startup ACM";
    break;
  case 3:
    s = "Diagnostic ACM";
    break;
  case 4:
    s = "Platform Boot Policy";
    break;
  case 5:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
switchD_00110580_caseD_5:
    usprintf(__return_storage_ptr__,"Unknown %02Xh",(ulong)(type & 0x7f));
    return __return_storage_ptr__;
  case 6:
    s = "FIT Reset State";
    break;
  case 7:
    s = "BIOS Startup Module";
    break;
  case 8:
    s = "TPM Policy";
    break;
  case 9:
    s = "BIOS Policy";
    break;
  case 10:
    s = "TXT Policy";
    break;
  case 0xb:
    s = "BootGuard Key Manifest";
    break;
  case 0xc:
    s = "BootGuard Boot Policy";
    break;
  case 0x10:
    s = "CSE SecureBoot Settings";
    break;
  case 0x1a:
    s = "VAB Provisioning Table";
    break;
  case 0x1b:
    s = "VAB Key Manifest";
    break;
  case 0x1c:
    s = "VAB Image Manifest";
    break;
  case 0x1d:
    s = "VAB Image Hash Descriptors";
    break;
  case 0x2c:
    s = "SACM Debug Record";
    break;
  case 0x2d:
    s = "ACM Feature Policy";
    break;
  case 0x2e:
    s = "SCRTM Error Record";
    break;
  case 0x2f:
    s = "JMP Debug Policy";
    break;
  default:
    if ((type & 0x7f) != 0x7f) goto switchD_00110580_caseD_5;
    s = "Empty";
  }
  Bstrlib::CBString::CBString(__return_storage_ptr__,s);
  return __return_storage_ptr__;
}

Assistant:

UString fitEntryTypeToUString(const UINT8 type)
{
    switch (type & 0x7F) {
        case INTEL_FIT_TYPE_HEADER:                     return UString("FIT Header");
        case INTEL_FIT_TYPE_MICROCODE:                  return UString("Microcode");
        case INTEL_FIT_TYPE_STARTUP_AC_MODULE:          return UString("Startup ACM");
        case INTEL_FIT_TYPE_DIAG_AC_MODULE:             return UString("Diagnostic ACM");
        case INTEL_FIT_TYPE_PLATFORM_BOOT_POLICY:       return UString("Platform Boot Policy");
        case INTEL_FIT_TYPE_FIT_RESET_STATE:            return UString("FIT Reset State");
        case INTEL_FIT_TYPE_BIOS_STARTUP_MODULE:        return UString("BIOS Startup Module");
        case INTEL_FIT_TYPE_TPM_POLICY:                 return UString("TPM Policy");
        case INTEL_FIT_TYPE_BIOS_POLICY:                return UString("BIOS Policy");
        case INTEL_FIT_TYPE_TXT_POLICY:                 return UString("TXT Policy");
        case INTEL_FIT_TYPE_BOOT_GUARD_KEY_MANIFEST:    return UString("BootGuard Key Manifest");
        case INTEL_FIT_TYPE_BOOT_GUARD_BOOT_POLICY:     return UString("BootGuard Boot Policy");
        case INTEL_FIT_TYPE_CSE_SECURE_BOOT:            return UString("CSE SecureBoot Settings");
        case INTEL_FIT_TYPE_VAB_PROVISIONING_TABLE:     return UString("VAB Provisioning Table");
        case INTEL_FIT_TYPE_VAB_KEY_MANIFEST:           return UString("VAB Key Manifest");
        case INTEL_FIT_TYPE_VAB_IMAGE_MANIFEST:         return UString("VAB Image Manifest");
        case INTEL_FIT_TYPE_VAB_IMAGE_HASH_DESCRIPTORS: return UString("VAB Image Hash Descriptors");
        case INTEL_FIT_TYPE_SACM_DEBUG_RECORD:          return UString("SACM Debug Record");
        case INTEL_FIT_TYPE_ACM_FEATURE_POLICY:         return UString("ACM Feature Policy");
        case INTEL_FIT_TYPE_SCRTM_ERROR_RECORD:         return UString("SCRTM Error Record");
        case INTEL_FIT_TYPE_JMP_DEBUG_POLICY:           return UString("JMP Debug Policy");
        case INTEL_FIT_TYPE_EMPTY:                      return UString("Empty");
    }
    
    return usprintf("Unknown %02Xh", (type & 0x7F));
}